

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncResult.h
# Opt level: O2

int __thiscall nrg::AsyncResult<int>::Impl::getResult(Impl *this)

{
  int iVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->guard_);
  if ((this->result_).super__Optional_base<int,_false>._M_engaged == false) {
    std::condition_variable::wait<nrg::AsyncResult<int>::Impl::getResult()const::_lambda()_1_>
              (&this->cond_,&uStack_18,(anon_class_8_1_8991fb9c)this);
  }
  iVar1 = (this->result_).super__Optional_base<int,_false>.field_0._M_payload;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return iVar1;
}

Assistant:

R getResult() const {
            std::unique_lock<std::mutex> lock(guard_);
            if (result_) {
                return *result_;
            }

            cond_.wait(lock, [this]() { return static_cast<bool>(result_); });
            return *result_;
        }